

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O0

void __thiscall HDual::major_rollback(HDual *this)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  size_type sVar4;
  double *pdVar5;
  int *piVar6;
  long in_RDI;
  uint i;
  MFinish *Fin;
  int iFn;
  double in_stack_ffffffffffffffb8;
  HModel *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar7;
  int local_c;
  
  local_c = *(int *)(in_RDI + 0xefe8);
  while (local_c = local_c + -1, -1 < local_c) {
    piVar6 = (int *)(in_RDI + 0x13bf8 + (long)local_c * 0x78);
    iVar1 = *piVar6;
    piVar2 = HModel::getNonbasicMove((HModel *)0x15c98f);
    piVar2[piVar6[0xc]] = iVar1;
    piVar2 = HModel::getNonbasicFlag((HModel *)0x15c9b0);
    piVar2[piVar6[0xc]] = 1;
    piVar2 = HModel::getNonbasicMove((HModel *)0x15c9d1);
    piVar2[piVar6[0xb]] = 0;
    piVar2 = HModel::getNonbasicFlag((HModel *)0x15c9f2);
    piVar2[piVar6[0xb]] = 0;
    iVar1 = piVar6[0xb];
    piVar2 = HModel::getBaseIndex((HModel *)0x15ca1f);
    piVar2[piVar6[10]] = iVar1;
    HModel::updateMatrix
              (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
               SUB84(in_stack_ffffffffffffffb8,0));
    uVar7 = 0;
    while( true ) {
      uVar3 = (ulong)uVar7;
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(piVar6 + 4));
      if (sVar4 <= uVar3) break;
      in_stack_ffffffffffffffc0 = *(HModel **)(in_RDI + 0x60);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(piVar6 + 4),(ulong)uVar7);
      HModel::flipBound((HModel *)CONCAT44(uVar7,in_stack_ffffffffffffffe0),
                        (int)((ulong)in_RDI >> 0x20));
      uVar7 = uVar7 + 1;
    }
    pdVar5 = HModel::getWorkShift((HModel *)0x15cac5);
    pdVar5[piVar6[0xc]] = 0.0;
    in_stack_ffffffffffffffb8 = *(double *)(piVar6 + 2);
    pdVar5 = HModel::getWorkShift((HModel *)0x15caf6);
    pdVar5[piVar6[0xb]] = in_stack_ffffffffffffffb8;
    *(int *)(*(long *)(in_RDI + 0x60) + 0x588) = *(int *)(*(long *)(in_RDI + 0x60) + 0x588) + -1;
  }
  return;
}

Assistant:

void HDual::major_rollback() {
    for (int iFn = multi_nFinish - 1; iFn >= 0; iFn--) {
        MFinish *Fin = &multi_finish[iFn];

        // 1. Roll back pivot
        model->getNonbasicMove()[Fin->columnIn] = Fin->moveIn;
        model->getNonbasicFlag()[Fin->columnIn] = 1;
        model->getNonbasicMove()[Fin->columnOut] = 0;
        model->getNonbasicFlag()[Fin->columnOut] = 0;
        model->getBaseIndex()[Fin->rowOut] = Fin->columnOut;

        // 2. Roll back matrix
        model->updateMatrix(Fin->columnOut, Fin->columnIn);

        // 3. Roll back flips
        for (unsigned i = 0; i < Fin->flipList.size(); i++)
            model->flipBound(Fin->flipList[i]);

        // 4. Roll back cost
        model->getWorkShift()[Fin->columnIn] = 0;
        model->getWorkShift()[Fin->columnOut] = Fin->shiftOut;

        // 5. The iteration count
        model->numberIteration--;
    }
}